

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.h
# Opt level: O2

TypeDef __thiscall winmd::reader::cache::find(cache *this,string_view *type_string)

{
  size_type __n;
  row_base<winmd::reader::TypeDef> rVar1;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  string local_40;
  
  __n = std::basic_string_view<char,_std::char_traits<char>_>::rfind
                  (type_string,'.',0xffffffffffffffff);
  if (__n != 0xffffffffffffffff) {
    local_60 = std::basic_string_view<char,_std::char_traits<char>_>::substr(type_string,0,__n);
    local_50 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (type_string,__n + 1,type_string->_M_len);
    rVar1 = (row_base<winmd::reader::TypeDef>)find(this,&local_60,&local_50);
    return (TypeDef)rVar1;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,"Type \'",(allocator<char> *)&local_60);
  impl::throw_invalid<std::basic_string_view<char,std::char_traits<char>>,char[35]>
            (&local_40,type_string,(char (*) [35])"\' is missing a namespace qualifier");
}

Assistant:

TypeDef find(std::string_view const& type_string) const
        {
            auto pos = type_string.rfind('.');

            if (pos == std::string_view::npos)
            {
                impl::throw_invalid("Type '", type_string, "' is missing a namespace qualifier");
            }

            return find(type_string.substr(0, pos), type_string.substr(pos + 1, type_string.size()));
        }